

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_filter_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_568eea::AV1HighbdSelfguidedFilterTest_DISABLED_SpeedTest_Test::TestBody
          (AV1HighbdSelfguidedFilterTest_DISABLED_SpeedTest_Test *this)

{
  int bit_depth;
  __suseconds_t _Var1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  AV1HighbdSelfguidedFilterTest_DISABLED_SpeedTest_Test *pAVar4;
  uint32_t uVar5;
  ParamType *pPVar6;
  ulong uVar7;
  ostream *poVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint16_t *puVar12;
  pointer *__ptr;
  SEARCH_METHODS *pSVar13;
  uint16_t *puVar14;
  long lVar15;
  bool bVar16;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  AssertHelper local_100;
  undefined8 *local_f8;
  aom_usec_timer tst_timer;
  aom_usec_timer ref_timer;
  AssertHelper local_80;
  int32_t *tmpbuf;
  ACMRandom rnd;
  int64_t ref_time;
  uint16_t *output_;
  uint16_t *input_;
  uint16_t *local_50;
  AV1HighbdSelfguidedFilterTest_DISABLED_SpeedTest_Test *local_48;
  int64_t tst_time;
  int xqd [2];
  
  pPVar6 = testing::
           WithParamInterface<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>_>
           ::GetParam();
  (this->super_AV1HighbdSelfguidedFilterTest).tst_fun_ =
       (SgrFunc)(pPVar6->
                super__Tuple_impl<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>
                ).
                super__Head_base<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_false>
                ._M_head_impl;
  pPVar6 = testing::
           WithParamInterface<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>_>
           ::GetParam();
  bit_depth = (pPVar6->
              super__Tuple_impl<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>
              ).super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  input_ = (uint16_t *)aom_memalign(0x20,0x28800);
  tst_timer.begin.tv_sec = 0;
  testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
            ((internal *)&ref_timer,"input_","nullptr",&input_,(void **)&tst_timer);
  _Var1 = ref_timer.begin.tv_usec;
  if ((char)ref_timer.begin.tv_sec == '\0') {
    testing::Message::Message((Message *)&tst_timer);
    if (ref_timer.begin.tv_usec == 0) {
      pSVar13 = "";
    }
    else {
      pSVar13 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
               ,0xff,(char *)pSVar13);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&tst_timer);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (tst_timer.begin.tv_sec != 0) {
      (**(code **)(*(long *)tst_timer.begin.tv_sec + 8))();
    }
    if (ref_timer.begin.tv_usec == 0) {
      return;
    }
    if (*(void **)ref_timer.begin.tv_usec != (void *)(ref_timer.begin.tv_usec + 0x10)) {
      operator_delete(*(void **)ref_timer.begin.tv_usec);
    }
  }
  else {
    if (ref_timer.begin.tv_usec != 0) {
      if (*(void **)ref_timer.begin.tv_usec != (void *)(ref_timer.begin.tv_usec + 0x10)) {
        operator_delete(*(void **)ref_timer.begin.tv_usec);
      }
      operator_delete((void *)_Var1);
    }
    output_ = (uint16_t *)aom_memalign(0x20,0x28800);
    tst_timer.begin.tv_sec = 0;
    testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
              ((internal *)&ref_timer,"output_","nullptr",&output_,(void **)&tst_timer);
    _Var1 = ref_timer.begin.tv_usec;
    if ((char)ref_timer.begin.tv_sec == '\0') {
      testing::Message::Message((Message *)&tst_timer);
      if (ref_timer.begin.tv_usec == 0) {
        pSVar13 = "";
      }
      else {
        pSVar13 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                 ,0x102,(char *)pSVar13);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&tst_timer);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (tst_timer.begin.tv_sec != 0) {
        (**(code **)(*(long *)tst_timer.begin.tv_sec + 8))();
      }
      if (ref_timer.begin.tv_usec == 0) {
        return;
      }
      if (*(void **)ref_timer.begin.tv_usec != (void *)(ref_timer.begin.tv_usec + 0x10)) {
        operator_delete(*(void **)ref_timer.begin.tv_usec);
      }
    }
    else {
      if (ref_timer.begin.tv_usec != 0) {
        if (*(void **)ref_timer.begin.tv_usec != (void *)(ref_timer.begin.tv_usec + 0x10)) {
          operator_delete(*(void **)ref_timer.begin.tv_usec);
        }
        operator_delete((void *)_Var1);
      }
      tmpbuf = (int32_t *)aom_memalign(0x20,0x13b9a0);
      tst_timer.begin.tv_sec = 0;
      testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                ((internal *)&ref_timer,"tmpbuf","nullptr",&tmpbuf,(void **)&tst_timer);
      _Var1 = ref_timer.begin.tv_usec;
      if ((char)ref_timer.begin.tv_sec != '\0') {
        if (ref_timer.begin.tv_usec != 0) {
          if (*(void **)ref_timer.begin.tv_usec != (void *)(ref_timer.begin.tv_usec + 0x10)) {
            operator_delete(*(void **)ref_timer.begin.tv_usec);
          }
          operator_delete((void *)_Var1);
        }
        puVar3 = input_;
        puVar2 = output_;
        rnd.random_.state_ = (Random)0xbaba;
        lVar15 = -0x10;
        puVar12 = input_;
        local_48 = this;
        do {
          lVar10 = 0;
          do {
            uVar5 = testing::internal::Random::Generate(&rnd.random_,0x80000000);
            puVar12[lVar10] = (ushort)(uVar5 >> 0xf) & ~(ushort)(-1 << ((byte)bit_depth & 0x1f));
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x120);
          lVar15 = lVar15 + 1;
          puVar12 = puVar12 + 0x120;
        } while (lVar15 != 0x110);
        uVar5 = testing::internal::Random::Generate(&rnd.random_,0x80);
        xqd[0] = uVar5 - 0x60;
        uVar5 = testing::internal::Random::Generate(&rnd.random_,0x80);
        xqd[1] = uVar5 - 0x20;
        av1_loop_restoration_precal();
        iVar9 = 0;
        gettimeofday((timeval *)&ref_timer,(__timezone_ptr_t)0x0);
        local_50 = puVar2 + 0x1210;
        do {
          uVar7 = 0;
          puVar12 = puVar3 + 0x1210;
          puVar14 = local_50;
          do {
            uVar11 = 0;
            do {
              av1_apply_selfguided_restoration_c
                        ((uint8_t *)(uVar11 + ((ulong)puVar12 >> 1)),0x40,0x40,0x120,0xf,xqd,
                         (uint8_t *)(((ulong)puVar14 >> 1) + uVar11),0x120,tmpbuf,bit_depth,1);
              bVar16 = uVar11 < 0xc0;
              uVar11 = uVar11 + 0x40;
            } while (bVar16);
            puVar14 = puVar14 + 0x4800;
            puVar12 = puVar12 + 0x4800;
            bVar16 = uVar7 < 0xc0;
            uVar7 = uVar7 + 0x40;
          } while (bVar16);
          iVar9 = iVar9 + 1;
        } while (iVar9 != 2000);
        iVar9 = 0;
        gettimeofday((timeval *)&ref_timer.end,(__timezone_ptr_t)0x0);
        lVar10 = ref_timer.end.tv_usec - ref_timer.begin.tv_usec;
        lVar15 = lVar10 + 1000000;
        if (-1 < lVar10) {
          lVar15 = lVar10;
        }
        ref_time = ((lVar10 >> 0x3f) +
                   (ref_timer.end.tv_sec -
                   CONCAT71(ref_timer.begin.tv_sec._1_7_,(char)ref_timer.begin.tv_sec))) * 1000000 +
                   lVar15;
        gettimeofday((timeval *)&tst_timer,(__timezone_ptr_t)0x0);
        pAVar4 = local_48;
        do {
          uVar7 = 0;
          puVar12 = puVar3 + 0x1210;
          puVar14 = puVar2 + 0x1210;
          do {
            uVar11 = 0;
            do {
              (*(pAVar4->super_AV1HighbdSelfguidedFilterTest).tst_fun_)
                        ((uint8_t *)(((ulong)puVar12 >> 1) + uVar11),0x40,0x40,0x120,0xf,xqd,
                         (uint8_t *)(((ulong)puVar14 >> 1) + uVar11),0x120,tmpbuf,bit_depth,1);
              bVar16 = uVar11 < 0xc0;
              uVar11 = uVar11 + 0x40;
            } while (bVar16);
            puVar14 = puVar14 + 0x4800;
            puVar12 = puVar12 + 0x4800;
            bVar16 = uVar7 < 0xc0;
            uVar7 = uVar7 + 0x40;
          } while (bVar16);
          iVar9 = iVar9 + 1;
        } while (iVar9 != 2000);
        gettimeofday((timeval *)&tst_timer.end,(__timezone_ptr_t)0x0);
        lVar10 = tst_timer.end.tv_usec - tst_timer.begin.tv_usec;
        lVar15 = lVar10 + 1000000;
        if (-1 < lVar10) {
          lVar15 = lVar10;
        }
        tst_time = ((lVar10 >> 0x3f) + (tst_timer.end.tv_sec - tst_timer.begin.tv_sec)) * 1000000 +
                   lVar15;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[          ] C time = ",0x16);
        poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms, SIMD time = ",0x11);
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms\n",4);
        testing::internal::CmpHelperGT<long,long>
                  ((internal *)&local_100,"ref_time","tst_time",&ref_time,&tst_time);
        if (local_100.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_108);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_108._M_head_impl + 0x10),
                     "Error: AV1HighbdSelfguidedFilterTest.SpeedTest, SIMD slower than C.\n",0x44);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_108._M_head_impl + 0x10),"C time: ",8);
          std::ostream::_M_insert<long>((long)(local_108._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_108._M_head_impl + 0x10)," us\n",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_108._M_head_impl + 0x10),"SIMD time: ",0xb);
          std::ostream::_M_insert<long>((long)(local_108._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_108._M_head_impl + 0x10)," us\n",4);
          if (local_f8 == (undefined8 *)0x0) {
            pSVar13 = "";
          }
          else {
            pSVar13 = (SEARCH_METHODS *)*local_f8;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                     ,0x13d,(char *)pSVar13);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_108);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_108._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_108._M_head_impl + 8))();
          }
        }
        if (local_f8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_f8 != local_f8 + 2) {
            operator_delete((undefined8 *)*local_f8);
          }
          operator_delete(local_f8);
        }
        aom_free(input_);
        aom_free(output_);
        aom_free(tmpbuf);
        return;
      }
      testing::Message::Message((Message *)&tst_timer);
      if (ref_timer.begin.tv_usec == 0) {
        pSVar13 = "";
      }
      else {
        pSVar13 = *(SEARCH_METHODS **)ref_timer.begin.tv_usec;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                 ,0x104,(char *)pSVar13);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&tst_timer);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (tst_timer.begin.tv_sec != 0) {
        (**(code **)(*(long *)tst_timer.begin.tv_sec + 8))();
      }
      if (ref_timer.begin.tv_usec == 0) {
        return;
      }
      if (*(void **)ref_timer.begin.tv_usec != (void *)(ref_timer.begin.tv_usec + 0x10)) {
        operator_delete(*(void **)ref_timer.begin.tv_usec);
      }
    }
  }
  operator_delete((void *)ref_timer.begin.tv_usec);
  return;
}

Assistant:

TEST_P(AV1HighbdSelfguidedFilterTest, DISABLED_SpeedTest) { RunSpeedTest(); }